

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

natwm_error string_to_number(char *number_string,intmax_t *dest)

{
  natwm_error nVar1;
  int *piVar2;
  intmax_t iVar3;
  undefined8 in_R9;
  undefined8 uVar4;
  char *local_30;
  char *endptr;
  
  uVar4 = 0x10aafb;
  local_30 = (char *)0x0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  iVar3 = strtoimax(number_string,&local_30,10);
  nVar1 = INVALID_INPUT_ERROR;
  if (((*piVar2 != 0x22) && (local_30 != number_string)) && (*local_30 == '\0')) {
    if (*piVar2 != 0) {
      internal_logger_long
                (natwm_logger,LEVEL_CRITICAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/common/string.c"
                 ,0x1c3,"Unhandleable input received - Exiting...",in_R9,uVar4);
      exit(1);
    }
    *dest = iVar3;
    nVar1 = NO_ERROR;
  }
  return nVar1;
}

Assistant:

enum natwm_error string_to_number(const char *number_string, intmax_t *dest)
{
        char *endptr = NULL;

        // Reset errno to 0 so we can test for ERANGE
        errno = 0;

        intmax_t result = strtoimax(number_string, &endptr, 10);

        if (errno == ERANGE || endptr == number_string || *endptr != '\0') {
                return INVALID_INPUT_ERROR;
        }

        if (errno != 0) {
                LOG_CRITICAL_LONG(natwm_logger, "Unhandleable input received - Exiting...");

                exit(EXIT_FAILURE);
        }

        *dest = result;

        return NO_ERROR;
}